

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O2

void __thiscall adios2::core::engine::CampaignManager::~CampaignManager(CampaignManager *this)

{
  if (this->m_Opened == true) {
    Close(this);
  }
  std::__cxx11::string::~string((string *)&this->m_CampaignDir);
  std::ofstream::~ofstream(&this->m_Output);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->cmap)._M_h);
  std::__cxx11::string::~string((string *)&this->m_Name);
  UserOptions::Campaign::~Campaign(&this->m_Options);
  return;
}

Assistant:

CampaignManager::~CampaignManager()
{
    if (m_Opened)
    {
        Close();
    }
}